

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

QPauseAnimation * __thiscall
QSequentialAnimationGroup::insertPause(QSequentialAnimationGroup *this,int index,int msecs)

{
  QPauseAnimation *this_00;
  
  if ((index < 0) || (*(ulong *)(*(long *)(this + 8) + 0xb0) < (ulong)(uint)index)) {
    insertPause();
    this_00 = (QPauseAnimation *)0x0;
  }
  else {
    this_00 = (QPauseAnimation *)operator_new(0x10);
    QPauseAnimation::QPauseAnimation(this_00,msecs,(QObject *)0x0);
    QAnimationGroup::insertAnimation((QAnimationGroup *)this,index,(QAbstractAnimation *)this_00);
  }
  return (QPauseAnimation *)this_00;
}

Assistant:

QPauseAnimation *QSequentialAnimationGroup::insertPause(int index, int msecs)
{
    Q_D(const QSequentialAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QSequentialAnimationGroup::insertPause: index is out of bounds");
        return nullptr;
    }

    QPauseAnimation *pause = new QPauseAnimation(msecs);
    insertAnimation(index, pause);
    return pause;
}